

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

void av1_generate_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,int block_size,
               uint32_t **src_pic_block_hash,uint32_t **dst_pic_block_hash,
               int8_t **src_pic_block_same_info,int8_t **dst_pic_block_same_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int in_EDX;
  long in_RSI;
  long *in_R8;
  long *in_R9;
  int x_pos_1;
  int y_pos_1;
  int size_minus_1;
  int x_pos;
  int y_pos;
  int pos;
  int length;
  uint32_t p [4];
  int quad_size;
  int src_size;
  int y_end;
  int x_end;
  int pic_width;
  CRC_CALCULATOR *calc_2;
  CRC_CALCULATOR *calc_1;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  bool bVar7;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff84;
  int local_78;
  int local_74;
  int local_70;
  
  iVar1 = *(int *)(in_RSI + 0x10);
  iVar2 = (*(int *)(in_RSI + 0x10) - in_EDX) + 1;
  iVar3 = (*(int *)(in_RSI + 0x18) - in_EDX) + 1;
  iVar4 = in_EDX >> 1;
  iVar5 = in_EDX >> 2;
  local_70 = 0;
  for (local_74 = 0; local_74 < iVar3; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < iVar2; local_78 = local_78 + 1) {
      uVar6 = av1_get_crc_value((CRC_CALCULATOR *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (uint8_t *)
                                CONCAT44(in_stack_ffffffffffffff7c,
                                         CONCAT13(in_stack_ffffffffffffff7b,
                                                  CONCAT12(in_stack_ffffffffffffff7a,
                                                           CONCAT11(in_stack_ffffffffffffff79,
                                                                    in_stack_ffffffffffffff78)))),0)
      ;
      *(uint32_t *)(*in_R8 + (long)local_70 * 4) = uVar6;
      uVar6 = av1_get_crc_value((CRC_CALCULATOR *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (uint8_t *)
                                CONCAT44(in_stack_ffffffffffffff7c,
                                         CONCAT13(in_stack_ffffffffffffff7b,
                                                  CONCAT12(in_stack_ffffffffffffff7a,
                                                           CONCAT11(in_stack_ffffffffffffff79,
                                                                    in_stack_ffffffffffffff78)))),0)
      ;
      *(uint32_t *)(in_R8[1] + (long)local_70 * 4) = uVar6;
      in_stack_ffffffffffffff7b = false;
      if ((((*(char *)(*in_R9 + (long)local_70) != '\0') &&
           (in_stack_ffffffffffffff7b = false, *(char *)(*in_R9 + (long)(local_70 + iVar5)) != '\0')
           ) && (in_stack_ffffffffffffff7b = false,
                *(char *)(*in_R9 + (long)(local_70 + iVar4)) != '\0')) &&
         ((in_stack_ffffffffffffff7b = false,
          *(char *)(*in_R9 + (long)(local_70 + iVar4 * iVar1)) != '\0' &&
          (in_stack_ffffffffffffff7b = false,
          *(char *)(*in_R9 + (long)(local_70 + iVar4 * iVar1 + iVar5)) != '\0')))) {
        in_stack_ffffffffffffff7b =
             *(char *)(*in_R9 + (long)(local_70 + iVar4 * iVar1 + iVar4)) != '\0';
      }
      *(undefined1 *)(*_y_pos_1 + (long)local_70) = in_stack_ffffffffffffff7b;
      in_stack_ffffffffffffff7a = false;
      if (((*(char *)(in_R9[1] + (long)local_70) != '\0') &&
          (in_stack_ffffffffffffff7a = false, *(char *)(in_R9[1] + (long)(local_70 + iVar4)) != '\0'
          )) && ((in_stack_ffffffffffffff7a = false,
                 *(char *)(in_R9[1] + (long)(local_70 + iVar5 * iVar1)) != '\0' &&
                 ((in_stack_ffffffffffffff7a = false,
                  *(char *)(in_R9[1] + (long)(local_70 + iVar5 * iVar1 + iVar4)) != '\0' &&
                  (in_stack_ffffffffffffff7a = false,
                  *(char *)(in_R9[1] + (long)(local_70 + iVar4 * iVar1)) != '\0')))))) {
        in_stack_ffffffffffffff7a =
             *(char *)(in_R9[1] + (long)(local_70 + iVar4 * iVar1 + iVar4)) != '\0';
      }
      *(undefined1 *)(_y_pos_1[1] + (long)local_70) = in_stack_ffffffffffffff7a;
      local_70 = local_70 + 1;
    }
    local_70 = in_EDX + -1 + local_70;
  }
  if (3 < in_EDX) {
    local_70 = 0;
    for (uVar9 = 0; (int)uVar9 < iVar3; uVar9 = uVar9 + 1) {
      for (uVar8 = 0; (int)uVar8 < iVar2; uVar8 = uVar8 + 1) {
        if ((*(char *)(*_y_pos_1 + (long)local_70) != '\0') ||
           (bVar7 = true, *(char *)(_y_pos_1[1] + (long)local_70) != '\0')) {
          bVar7 = (uVar8 & in_EDX - 1U) == 0 && (uVar9 & in_EDX - 1U) == 0;
        }
        *(bool *)(_y_pos_1[2] + (long)local_70) = bVar7;
        local_70 = local_70 + 1;
      }
      local_70 = in_EDX + -1 + local_70;
    }
  }
  return;
}

Assistant:

void av1_generate_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                   const YV12_BUFFER_CONFIG *picture,
                                   int block_size,
                                   uint32_t *src_pic_block_hash[2],
                                   uint32_t *dst_pic_block_hash[2],
                                   int8_t *src_pic_block_same_info[3],
                                   int8_t *dst_pic_block_same_info[3]) {
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int pic_width = picture->y_crop_width;
  const int x_end = picture->y_crop_width - block_size + 1;
  const int y_end = picture->y_crop_height - block_size + 1;

  const int src_size = block_size >> 1;
  const int quad_size = block_size >> 2;

  uint32_t p[4];
  const int length = sizeof(p);

  int pos = 0;
  for (int y_pos = 0; y_pos < y_end; y_pos++) {
    for (int x_pos = 0; x_pos < x_end; x_pos++) {
      p[0] = src_pic_block_hash[0][pos];
      p[1] = src_pic_block_hash[0][pos + src_size];
      p[2] = src_pic_block_hash[0][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[0][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[0][pos] =
          av1_get_crc_value(calc_1, (uint8_t *)p, length);

      p[0] = src_pic_block_hash[1][pos];
      p[1] = src_pic_block_hash[1][pos + src_size];
      p[2] = src_pic_block_hash[1][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[1][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[1][pos] =
          av1_get_crc_value(calc_2, (uint8_t *)p, length);

      dst_pic_block_same_info[0][pos] =
          src_pic_block_same_info[0][pos] &&
          src_pic_block_same_info[0][pos + quad_size] &&
          src_pic_block_same_info[0][pos + src_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + quad_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + src_size];

      dst_pic_block_same_info[1][pos] =
          src_pic_block_same_info[1][pos] &&
          src_pic_block_same_info[1][pos + src_size] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width + src_size] &&
          src_pic_block_same_info[1][pos + src_size * pic_width] &&
          src_pic_block_same_info[1][pos + src_size * pic_width + src_size];
      pos++;
    }
    pos += block_size - 1;
  }

  if (block_size >= 4) {
    const int size_minus_1 = block_size - 1;
    pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        dst_pic_block_same_info[2][pos] =
            (!dst_pic_block_same_info[0][pos] &&
             !dst_pic_block_same_info[1][pos]) ||
            (((x_pos & size_minus_1) == 0) && ((y_pos & size_minus_1) == 0));
        pos++;
      }
      pos += block_size - 1;
    }
  }
}